

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O1

void __thiscall
agge::tests::PathStrokeTests::TwoOutlinesAreGeneratedForPolygons(PathStrokeTests *this)

{
  size_t sVar1;
  double dVar2;
  join *pjVar3;
  real_t rVar4;
  stroke s;
  stroke local_800;
  undefined1 local_7a8 [8];
  int local_7a0;
  point local_79c;
  undefined8 local_790;
  int local_788;
  point local_784;
  ulong local_778;
  int local_770;
  point local_76c;
  point local_760;
  point local_754;
  point local_748;
  ulong local_73c;
  int local_734;
  point local_730;
  point local_724;
  point local_718;
  point local_70c;
  ulong local_700;
  int local_6f8;
  point local_6f4;
  point local_6e8;
  point local_6dc;
  point local_6d0;
  ulong local_6c4;
  int local_6bc;
  real_t rStack_6b8;
  real_t rStack_6b4;
  int iStack_6b0;
  point local_6ac;
  point local_6a0;
  point local_694;
  point local_688;
  ulong local_67c;
  int local_674;
  point local_670;
  point local_664;
  point local_658;
  point local_64c;
  ulong local_640;
  int local_638;
  point local_634;
  point local_628;
  point local_61c;
  point local_610;
  ulong local_604;
  int local_5fc;
  point local_5f8;
  point local_5ec;
  point local_5e0;
  point local_5d4;
  ulong local_5c8;
  int local_5c0;
  real_t rStack_5bc;
  real_t rStack_5b8;
  int iStack_5b4;
  point local_5b0 [2];
  undefined1 local_598 [8];
  int local_590;
  undefined8 local_58c;
  undefined4 local_584;
  undefined8 local_580;
  int local_578;
  pointer local_574;
  int local_56c;
  pointer local_568;
  int local_560;
  pointer local_55c;
  int local_554;
  pointer local_550;
  int local_548;
  pointer local_544;
  int local_53c;
  pointer local_538;
  int local_530;
  pointer local_52c;
  int local_524;
  pointer local_520;
  int local_518;
  pointer local_514;
  int local_50c;
  pointer local_508;
  int local_500;
  pointer local_4fc;
  int local_4f4;
  pointer local_4f0;
  int local_4e8;
  pointer local_4e4;
  int local_4dc;
  pointer local_4d8;
  int local_4d0;
  pointer local_4cc;
  int local_4c4;
  pointer local_4c0;
  int local_4b8;
  pointer local_4b4;
  int local_4ac;
  pointer local_4a8;
  int local_4a0;
  pointer local_49c;
  int local_494;
  pointer local_490;
  int local_488;
  pointer local_484;
  int local_47c;
  pointer local_478;
  int local_470;
  pointer local_46c;
  int local_464;
  pointer local_460;
  int local_458;
  pointer local_454;
  int local_44c;
  pointer local_448;
  int local_440;
  pointer local_43c;
  int local_434;
  pointer local_430;
  int local_428;
  pointer local_424;
  int local_41c;
  pointer local_418;
  int local_410;
  pointer local_40c;
  int local_404;
  pointer local_400;
  int local_3f8;
  pointer local_3f4;
  int local_3ec;
  pointer local_3e8;
  int local_3e0;
  pointer local_3dc;
  int local_3d4;
  pointer local_3d0;
  int local_3c8;
  pointer local_3c4;
  int local_3bc;
  pointer local_3b8;
  int local_3b0;
  pointer local_3ac;
  int local_3a4;
  pointer local_3a0;
  int local_398;
  pointer local_388;
  int local_380;
  pointer local_37c;
  int local_374;
  pointer local_370;
  int local_368;
  pointer local_364;
  int local_35c;
  pointer local_358;
  int local_350;
  pointer local_34c;
  int local_344;
  pointer local_340;
  int local_338;
  pointer local_334;
  int local_32c;
  pointer local_328;
  int local_320;
  pointer local_31c;
  int local_314;
  pointer local_310;
  int local_308;
  pointer local_304;
  int local_2fc;
  pointer local_2f8;
  int local_2f0;
  pointer local_2ec;
  int local_2e4;
  pointer local_2e0;
  int local_2d8;
  pointer local_2d4;
  int local_2cc;
  pointer local_2c8;
  int local_2c0;
  pointer local_2bc;
  int local_2b4;
  pointer local_2b0;
  int local_2a8;
  pointer local_2a4;
  int local_29c;
  pointer local_298;
  int local_290;
  pointer local_28c;
  int local_284;
  pointer local_280;
  int local_278;
  pointer local_274;
  int local_26c;
  pointer local_268;
  int local_260;
  pointer local_25c;
  int local_254;
  pointer local_250;
  int local_248;
  pointer local_244;
  int local_23c;
  pointer local_238;
  int local_230;
  pointer local_22c;
  int local_224;
  pointer local_220;
  int local_218;
  pointer local_214;
  int local_20c;
  pointer local_208;
  int local_200;
  point local_1f8;
  undefined8 local_1ec;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined8 local_1d4;
  undefined4 local_1cc;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined8 local_1bc;
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined4 local_1a8;
  undefined8 local_1a4;
  undefined4 local_19c;
  undefined8 local_198;
  undefined4 local_190;
  undefined8 local_18c;
  undefined4 local_184;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_174;
  undefined4 local_16c;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_15c;
  undefined4 local_154;
  ulong local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_12c;
  undefined4 local_124;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_114;
  undefined4 local_10c;
  ulong local_108;
  undefined4 local_100;
  undefined8 local_fc;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_cc;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_b4;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_9c;
  undefined4 local_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined4 local_70;
  string local_60;
  LocationInfo local_40;
  
  stroke::stroke(&local_800);
  stroke::add_vertex(&local_800,1.0,1.0,1);
  stroke::add_vertex(&local_800,4.0,5.0,2);
  stroke::add_vertex(&local_800,4.0,15.0,2);
  stroke::add_vertex(&local_800,0.0,0.0,0x30);
  sVar1 = this->amount_alive;
  this->amount_alive = sVar1 + 1;
  pjVar3 = (join *)operator_new(0x10);
  pjVar3->_vptr_join = (_func_int **)&PTR__counted_001c2160;
  pjVar3[1]._vptr_join = (_func_int **)this;
  this->amount_alive = sVar1 + 2;
  pjVar3->_vptr_join = (_func_int **)&PTR__counted_001c2138;
  if (local_800._join != (join *)0x0) {
    (*(local_800._join)->_vptr_join[1])();
  }
  this->amount_alive = this->amount_alive - 1;
  local_800._join = pjVar3;
  stroke::width(&local_800,2.0);
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_380 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_388 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_374 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_37c = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_368 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_370 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_35c = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_364 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_350 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_358 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_344 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_34c = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_338 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_340 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_32c = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_334 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_320 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_328 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_314 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_31c = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_308 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_310 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2fc = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_304 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2f0 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2f8 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2e4 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2ec = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2d8 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2e0 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2cc = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2d4 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2c0 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2c8 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2b4 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2bc = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_2a8 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2b0 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_29c = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_2a4 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_290 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_298 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_284 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_28c = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_278 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_280 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_26c = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_274 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_260 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_268 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_254 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_25c = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_248 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_250 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_23c = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_244 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_230 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_238 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_224 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_22c = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_218 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_220 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_20c = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_214 = (pointer)local_598;
  local_590 = 0;
  local_598 = (undefined1  [8])0x0;
  local_200 = stroke::vertex(&local_800,(real_t *)local_598,(real_t *)(local_598 + 4));
  local_208 = (pointer)local_598;
  dVar2 = sqrt(5.57859275551463e-315);
  local_1f8.y = SUB84(dVar2,0);
  local_1f8.x = 1.0;
  local_1f8.command = 1;
  local_1ec = 0x4170000040800000;
  local_1e4 = 2;
  local_1e0 = 0x3f8000003f800000;
  local_1d8 = 2;
  local_1d4 = 0x40a0000040800000;
  local_1cc = 2;
  local_1c8 = 0x40a00000;
  local_1c0 = 2;
  local_1bc = 0x40a000003f800000;
  local_1b4 = 2;
  local_1b0 = 0x3f8000003f800000;
  local_1a8 = 2;
  local_1a4 = 0x40a0000040800000;
  local_19c = 2;
  local_198 = 0x4170000040800000;
  local_190 = 2;
  local_18c = 0x41200000;
  local_184 = 2;
  local_180 = 0x412000003f800000;
  local_178 = 2;
  local_174 = 0x40a0000040800000;
  local_16c = 2;
  local_168 = 0x4170000040800000;
  local_160 = 2;
  local_15c = 0x3f8000003f800000;
  local_154 = 2;
  dVar2 = sqrt(5.57859275551463e-315);
  local_150 = (ulong)dVar2 & 0xffffffff;
  local_148 = 2;
  uStack_140 = 0x3000000000;
  local_138 = 0x40a000003f800000;
  local_130 = 1;
  local_12c = 0x40a0000040800000;
  local_124 = 2;
  local_120 = 0x3f8000003f800000;
  local_118 = 2;
  local_114 = 0x4170000040800000;
  local_10c = 2;
  dVar2 = sqrt(5.57859275551463e-315);
  local_108 = (ulong)dVar2 & 0xffffffff;
  local_100 = 2;
  dVar2 = sqrt(5.57859275551463e-315);
  local_fc = CONCAT44(SUB84(dVar2,0),0x3f800000);
  local_f4 = 2;
  local_f0 = 0x3f8000003f800000;
  local_e8 = 2;
  local_e4 = 0x4170000040800000;
  local_dc = 2;
  local_d8 = 0x40a0000040800000;
  local_d0 = 2;
  local_cc = 0x41200000;
  local_c4 = 2;
  local_c0 = 0x412000003f800000;
  local_b8 = 2;
  local_b4 = 0x4170000040800000;
  local_ac = 2;
  local_a8 = 0x40a0000040800000;
  local_a0 = 2;
  local_9c = 0x3f8000003f800000;
  local_94 = 2;
  local_90 = 0x40a00000;
  local_88 = 2;
  uStack_84 = 0;
  uStack_80 = 0;
  uStack_7c = 0x30;
  local_78 = 0;
  local_70 = 0;
  local_7a8 = (undefined1  [8])&local_79c.y;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_598,(string *)local_7a8,0x175);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,33ul>
            ((point (*) [33])&local_1f8,(point (*) [33])&local_388,(LocationInfo *)local_598);
  if (local_598 != (undefined1  [8])((long)&local_58c + 4)) {
    operator_delete((void *)local_598);
  }
  if (local_7a8 != (undefined1  [8])&local_79c.y) {
    operator_delete((void *)local_7a8);
  }
  stroke::remove_all(&local_800);
  stroke::add_vertex(&local_800,1.0,1.0,1);
  stroke::add_vertex(&local_800,5.0,2.0,2);
  stroke::add_vertex(&local_800,4.0,6.0,2);
  stroke::add_vertex(&local_800,0.0,5.0,2);
  stroke::add_vertex(&local_800,0.0,0.0,0x30);
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_590 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_598 = local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_584 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_58c = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_578 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_580 = local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_56c = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_574 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_560 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_568 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_554 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_55c = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_548 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_550 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_53c = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_544 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_530 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_538 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_524 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_52c = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_518 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_520 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_50c = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_514 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_500 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_508 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4f4 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4fc = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4e8 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4f0 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4dc = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4e4 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4d0 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4d8 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4c4 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4cc = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4b8 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4c0 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4ac = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4b4 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_4a0 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_4a8 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_494 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_49c = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_488 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_490 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_47c = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_484 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_470 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_478 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_464 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_46c = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_458 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_460 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_44c = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_454 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_440 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_448 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_434 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_43c = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_428 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_430 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_41c = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_424 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_410 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_418 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_404 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_40c = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3f8 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_400 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3ec = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3f4 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3e0 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3e8 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3d4 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3dc = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3c8 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3d0 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3bc = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3c4 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3b0 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3b8 = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_3a4 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3ac = (pointer)local_7a8;
  local_7a0 = 0;
  local_7a8 = (undefined1  [8])0x0;
  local_398 = stroke::vertex(&local_800,(real_t *)local_7a8,(real_t *)(local_7a8 + 4));
  local_3a0 = (pointer)local_7a8;
  dVar2 = sqrt(5.43191549518332e-315);
  rVar4 = SUB84(dVar2,0);
  local_7a8 = (undefined1  [8])CONCAT44(rVar4,0x3f800000);
  local_7a0 = 1;
  local_79c.x = 0.0;
  local_79c.y = 5.0;
  local_79c.command = 2;
  local_790 = 0x3f8000003f800000;
  local_788 = 2;
  local_784.x = 5.0;
  local_784.y = 2.0;
  local_784.command = 2;
  local_778 = (ulong)dVar2 & 0xffffffff;
  local_770 = 2;
  local_76c.y = rVar4;
  local_76c.x = 1.0;
  local_76c.command = 2;
  local_760.x = 1.0;
  local_760.y = 1.0;
  local_760.command = 2;
  local_754.x = 5.0;
  local_754.y = 2.0;
  local_754.command = 2;
  local_748.x = 4.0;
  local_748.y = 6.0;
  local_748.command = 2;
  local_734 = 2;
  local_730.y = rVar4;
  local_730.x = 1.0;
  local_730.command = 2;
  local_724.x = 5.0;
  local_724.y = 2.0;
  local_724.command = 2;
  local_718.x = 4.0;
  local_718.y = 6.0;
  local_718.command = 2;
  local_70c.x = 0.0;
  local_70c.y = 5.0;
  local_70c.command = 2;
  local_6f8 = 2;
  local_6f4.y = rVar4;
  local_6f4.x = 1.0;
  local_6f4.command = 2;
  local_6e8.x = 4.0;
  local_6e8.y = 6.0;
  local_6e8.command = 2;
  local_6dc.x = 0.0;
  local_6dc.y = 5.0;
  local_6dc.command = 2;
  local_6d0.x = 1.0;
  local_6d0.y = 1.0;
  local_6d0.command = 2;
  local_6bc = 2;
  rStack_6b8 = 0.0;
  rStack_6b4 = 0.0;
  iStack_6b0 = 0x30;
  local_6ac.y = rVar4;
  local_6ac.x = 1.0;
  local_6ac.command = 1;
  local_6a0.x = 5.0;
  local_6a0.y = 2.0;
  local_6a0.command = 2;
  local_694.x = 1.0;
  local_694.y = 1.0;
  local_694.command = 2;
  local_688.x = 0.0;
  local_688.y = 5.0;
  local_688.command = 2;
  local_674 = 2;
  local_670.y = rVar4;
  local_670.x = 1.0;
  local_670.command = 2;
  local_664.x = 1.0;
  local_664.y = 1.0;
  local_664.command = 2;
  local_658.x = 0.0;
  local_658.y = 5.0;
  local_658.command = 2;
  local_64c.x = 4.0;
  local_64c.y = 6.0;
  local_64c.command = 2;
  local_638 = 2;
  local_634.y = rVar4;
  local_634.x = 1.0;
  local_634.command = 2;
  local_628.x = 0.0;
  local_628.y = 5.0;
  local_628.command = 2;
  local_61c.x = 4.0;
  local_61c.y = 6.0;
  local_61c.command = 2;
  local_610.x = 5.0;
  local_610.y = 2.0;
  local_610.command = 2;
  local_5fc = 2;
  local_5f8.y = rVar4;
  local_5f8.x = 1.0;
  local_5f8.command = 2;
  local_5ec.x = 4.0;
  local_5ec.y = 6.0;
  local_5ec.command = 2;
  local_5e0.x = 5.0;
  local_5e0.y = 2.0;
  local_5e0.command = 2;
  local_5d4.x = 1.0;
  local_5d4.y = 1.0;
  local_5d4.command = 2;
  local_5c0 = 2;
  rStack_5bc = 0.0;
  rStack_5b8 = 0.0;
  iStack_5b4 = 0x30;
  local_5b0[0].x = 0.0;
  local_5b0[0].y = 0.0;
  local_5b0[0].command = 0;
  local_73c = local_778;
  local_700 = local_778;
  local_6c4 = local_778;
  local_67c = local_778;
  local_640 = local_778;
  local_604 = local_778;
  local_5c8 = local_778;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_60,0x19e);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,43ul>
            ((point (*) [43])local_7a8,(point (*) [43])local_598,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != &local_40.filename.field_2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  stroke::~stroke(&local_800);
  return;
}

Assistant:

test( TwoOutlinesAreGeneratedForPolygons )
			{
				// INIT
				stroke s;

				move_to(s, 1.0f, 1.0f);
				line_to(s, 4.0f, 5.0f);
				line_to(s, 4.0f, 15.0f);
				end_poly(s, true);

				s.set_join(passthrough_join(amount_alive));
				s.width(2.0f);

				// ACT
				mocks::path::point points1[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.0f, sqrt(205.0f)), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(5.0f, 0.0f),
					lineto(1.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(sqrt(205.0f), 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, 5.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(sqrt(205.0f), 0.0f),
					lineto(1.0f, sqrt(205.0f)), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();

				move_to(s, 1.0f, 1.0f);
				line_to(s, 5.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);
				line_to(s, 0.0f, 5.0f);
				end_poly(s, true);

				// ACT
				mocks::path::point points2[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				real_t l = sqrt(17.0f);
				mocks::path::point reference2[] = {
					moveto(1.0f, l), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, l), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}